

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O1

void __thiscall
ExemptionSearchIRCCommand::trigger
          (ExemptionSearchIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  basic_string_view<char,_std::char_traits<char>_> lhs;
  basic_string_view<char,_std::char_traits<char>_> lhs_00;
  basic_string_view<char,_std::char_traits<char>_> lhs_01;
  basic_string_view<char,_std::char_traits<char>_> lhs_02;
  basic_string_view<char,_std::char_traits<char>_> lhs_03;
  bool bVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  tm *__tp;
  undefined8 uVar5;
  char *pcVar6;
  size_type __rlen;
  long lVar7;
  size_t sVar8;
  char *pcVar9;
  undefined4 uVar10;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  basic_string_view<char,_std::char_traits<char>_> rhs_00;
  basic_string_view<char,_std::char_traits<char>_> rhs_01;
  basic_string_view<char,_std::char_traits<char>_> rhs_02;
  basic_string_view<char,_std::char_traits<char>_> rhs_03;
  Entry *entry;
  string types;
  string out;
  string ip_str;
  function<bool_(unsigned_int)> isMatch;
  time_t current_time;
  string_view params;
  string local_178;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  command_split;
  char timeStr [256];
  
  pcVar9 = nick._M_str;
  sVar8 = nick._M_len;
  pcVar6 = pcVar9;
  plVar3 = (long *)RenX::ExemptionDatabase::getEntries();
  if (parameters._M_len == 0) {
    string_printf_abi_cxx11_
              ((string *)timeStr,"There are a total of %u entries in the exemption database.",
               plVar3[1] - *plVar3 >> 3);
    Jupiter::IRC::Client::sendNotice(source,sVar8,pcVar9,timeStr._8_8_,timeStr._0_8_);
    if ((char *)timeStr._0_8_ != timeStr + 0x10) {
      operator_delete((void *)timeStr._0_8_,timeStr._16_8_ + 1);
    }
  }
  else {
    if (plVar3[1] == *plVar3) {
      Jupiter::IRC::Client::sendNotice(source,sVar8,pcVar9,0x20,"The exemption database is empty!");
      return;
    }
    jessilib::
    word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
              (&command_split,(jessilib *)parameters._M_str,parameters._M_str + parameters._M_len,
               " \t","",pcVar6);
    params._M_len = command_split.second._M_len;
    params._M_str = command_split.second._M_str;
    isMatch.super__Function_base._M_manager = (_Manager_type)0x0;
    isMatch._M_invoker = (_Invoker_type)0x0;
    isMatch.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    isMatch.super__Function_base._M_functor._8_8_ = 0;
    isMatch.super__Function_base._M_functor._M_unused._M_object = operator_new(0x18);
    *(function<bool_(unsigned_int)> **)isMatch.super__Function_base._M_functor._M_unused._0_8_ =
         &isMatch;
    *(Entry ***)((long)isMatch.super__Function_base._M_functor._M_unused._0_8_ + 8) = &entry;
    *(string_view **)((long)isMatch.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
         &params;
    isMatch._M_invoker =
         std::
         _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Plugins/RenX/RenX.Commands/RenX_Commands.cpp:2481:48)>
         ::_M_invoke;
    isMatch.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Plugins/RenX/RenX.Commands/RenX_Commands.cpp:2481:48)>
         ::_M_manager;
    lhs_03._M_str = command_split.first._M_str;
    lhs_03._M_len = command_split.first._M_len;
    lhs_02._M_str = command_split.first._M_str;
    lhs_02._M_len = command_split.first._M_len;
    lhs_01._M_str = command_split.first._M_str;
    lhs_01._M_len = command_split.first._M_len;
    lhs_00._M_str = command_split.first._M_str;
    lhs_00._M_len = command_split.first._M_len;
    lhs._M_str = command_split.first._M_str;
    lhs._M_len = command_split.first._M_len;
    rhs._M_str = "all";
    rhs._M_len = 3;
    bVar1 = jessilib::equalsi<char,char>(lhs,rhs);
    uVar10 = 1;
    if ((!bVar1) &&
       ((command_split.first._M_len != 1 ||
        (iVar2 = bcmp(command_split.first._M_str,"*",1), iVar2 != 0)))) {
      rhs_00._M_str = "ip";
      rhs_00._M_len = 2;
      bVar1 = jessilib::equalsi<char,char>(lhs_00,rhs_00);
      uVar10 = 2;
      if (!bVar1) {
        rhs_01._M_str = "steam";
        rhs_01._M_len = 5;
        bVar1 = jessilib::equalsi<char,char>(lhs_01,rhs_01);
        uVar10 = 3;
        if (!bVar1) {
          rhs_02._M_str = "setter";
          rhs_02._M_len = 6;
          bVar1 = jessilib::equalsi<char,char>(lhs_02,rhs_02);
          uVar10 = 4;
          if (!bVar1) {
            rhs_03._M_str = "active";
            rhs_03._M_len = 6;
            bVar1 = jessilib::equalsi<char,char>(lhs_03,rhs_03);
            uVar10 = 5;
            if (!bVar1) {
              params._M_len = parameters._M_len;
              params._M_str = parameters._M_str;
              uVar10 = 0;
            }
          }
        }
      }
    }
    out._M_dataplus._M_p = (pointer)&out.field_2;
    out._M_string_length = 0;
    out.field_2._M_local_buf[0] = '\0';
    types._M_dataplus._M_p = (pointer)&types.field_2;
    types._M_string_length = 0;
    types.field_2._M_local_buf[0] = '\0';
    lVar4 = *plVar3;
    if (plVar3[1] != lVar4) {
      lVar7 = 0;
      do {
        entry = *(Entry **)(lVar4 + lVar7 * 8);
        ip_str._M_dataplus._M_p._0_4_ = uVar10;
        if (isMatch.super__Function_base._M_manager == (_Manager_type)0x0) {
          uVar5 = std::__throw_bad_function_call();
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)types._M_dataplus._M_p != &types.field_2) {
            operator_delete(types._M_dataplus._M_p,
                            CONCAT71(types.field_2._M_allocated_capacity._1_7_,
                                     types.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out._M_dataplus._M_p != &out.field_2) {
            operator_delete(out._M_dataplus._M_p,
                            CONCAT71(out.field_2._M_allocated_capacity._1_7_,
                                     out.field_2._M_local_buf[0]) + 1);
          }
          if (isMatch.super__Function_base._M_manager != (_Manager_type)0x0) {
            (*isMatch.super__Function_base._M_manager)
                      ((_Any_data *)&isMatch,(_Any_data *)&isMatch,__destroy_functor);
          }
          _Unwind_Resume(uVar5);
        }
        bVar1 = (*isMatch._M_invoker)((_Any_data *)&isMatch,(uint *)&ip_str);
        if (bVar1) {
          current_time = (entry->timestamp).__d.__r / 1000000000;
          Jupiter::Socket::ntop4_abi_cxx11_((uint)&ip_str);
          __tp = localtime(&current_time);
          strftime(timeStr,0x100,"%b %d %Y, %H:%M:%S",__tp);
          if (entry->flags == '\0') {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_replace(&types,0,types._M_string_length," NULL;",6);
          }
          else {
            types._M_string_length = 0;
            *types._M_dataplus._M_p = '\0';
            if ((entry->flags & 4) != 0) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&types," kick",5);
            }
            if ((entry->flags & 2) != 0) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&types," ban",4);
            }
            if ((entry->flags & 0x40) != 0) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append(&types," ip",3);
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&types,";",1);
          }
          pcVar6 = "in";
          if ((char)entry->flags < '\0') {
            pcVar6 = "";
          }
          string_printf_abi_cxx11_
                    (&local_178,
                     "ID: %lu (%sactive); Date: %s; IP: %.*s/%u; Steam: %llu; Types:%.*s Setter: %.*s"
                     ,lVar7,pcVar6,timeStr,ip_str._M_string_length,
                     CONCAT44(ip_str._M_dataplus._M_p._4_4_,ip_str._M_dataplus._M_p._0_4_),
                     (ulong)entry->prefix_length,entry->steamid,types._M_string_length,
                     types._M_dataplus._M_p,(entry->setter)._M_string_length,
                     (entry->setter)._M_dataplus._M_p);
          trigger();
          Jupiter::IRC::Client::sendNotice
                    (source,sVar8,pcVar9,out._M_string_length,out._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(ip_str._M_dataplus._M_p._4_4_,ip_str._M_dataplus._M_p._0_4_) !=
              &ip_str.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(ip_str._M_dataplus._M_p._4_4_,ip_str._M_dataplus._M_p._0_4_),
                            ip_str.field_2._M_allocated_capacity + 1);
          }
        }
        lVar7 = lVar7 + 1;
        lVar4 = *plVar3;
      } while (lVar7 != plVar3[1] - lVar4 >> 3);
    }
    if (out._M_string_length == 0) {
      Jupiter::IRC::Client::sendNotice(source,sVar8,pcVar9,0x11,"No matches found.");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)types._M_dataplus._M_p != &types.field_2) {
      operator_delete(types._M_dataplus._M_p,
                      CONCAT71(types.field_2._M_allocated_capacity._1_7_,
                               types.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != &out.field_2) {
      operator_delete(out._M_dataplus._M_p,
                      CONCAT71(out.field_2._M_allocated_capacity._1_7_,out.field_2._M_local_buf[0])
                      + 1);
    }
    if (isMatch.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*isMatch.super__Function_base._M_manager)
                ((_Any_data *)&isMatch,(_Any_data *)&isMatch,__destroy_functor);
    }
  }
  return;
}

Assistant:

void ExemptionSearchIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	const auto& entries = RenX::exemptionDatabase->getEntries();
	if (!parameters.empty())
	{
		if (entries.size() == 0) {
			source->sendNotice(nick, "The exemption database is empty!"sv);
		}
		else {
			auto command_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);

			RenX::ExemptionDatabase::Entry *entry;
			std::string_view params = command_split.second;
			std::function<bool(unsigned int)> isMatch = [&](unsigned int type_l) -> bool {
				switch (type_l)
				{
				default:
				case 0:	// ANY
					return isMatch(1) || isMatch(2) || isMatch(3) || isMatch(4);
				case 1: // ALL
					return true;
				case 2:	// IP
					return entry->ip == Jupiter::asUnsignedInt(params);
				case 3:	// STEAM
					return entry->steamid == Jupiter::asUnsignedLongLong(params);
				case 4:	// SETTER
					return jessilib::equalsi(entry->setter, params);
				case 5:	// ACTIVE
					return entry->is_active() == Jupiter::asBool(params);
				}
			};

			unsigned int type;
			std::string_view type_str = command_split.first;
			if (jessilib::equalsi(type_str, "all"sv) || type_str == "*"sv)
				type = 1;
			else if (jessilib::equalsi(type_str, "ip"sv))
				type = 2;
			else if (jessilib::equalsi(type_str, "steam"sv))
				type = 3;
			else if (jessilib::equalsi(type_str, "setter"sv))
				type = 4;
			else if (jessilib::equalsi(type_str, "active"sv))
				type = 5;
			else {
				type = 0;
				params = parameters;
			}

			std::string out;
			std::string types;
			char timeStr[256];
			for (size_t i = 0; i != entries.size(); i++)
			{
				entry = entries[i].get();
				if (isMatch(type))
				{
					time_t current_time = std::chrono::system_clock::to_time_t(entry->timestamp);
					std::string ip_str = Jupiter::Socket::ntop4(entry->ip);
					strftime(timeStr, sizeof(timeStr), "%b %d %Y, %H:%M:%S", localtime(&current_time));

					if ((entry->flags & 0xFF) == 0)
						types = " NULL;"sv;
					else
					{
						types.clear();
						if (entry->is_type_kick())
							types += " kick"sv;
						if (entry->is_type_ban())
							types += " ban"sv;
						if (entry->is_ip_exemption())
							types += " ip"sv;
						types += ";"sv;
					}

					out = string_printf("ID: %lu (%sactive); Date: %s; IP: %.*s/%u; Steam: %llu; Types:%.*s Setter: %.*s",
						i, entry->is_active() ? "" : "in", timeStr, ip_str.size(), ip_str.data(), entry->prefix_length, entry->steamid,
						types.size(), types.data(), entry->setter.size(), entry->setter.data());

					source->sendNotice(nick, out);
				}
			}
			if (out.empty())
				source->sendNotice(nick, "No matches found."sv);
		}
	}
	else
		source->sendNotice(nick, string_printf("There are a total of %u entries in the exemption database.", entries.size()));
}